

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O2

int ReadDigit(char **LineStr,int MaxValue)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar1 = *LineStr;
  iVar2 = 0;
  while( true ) {
    pcVar3 = pcVar1 + 1;
    if (9 < (byte)(*pcVar1 - 0x30U)) break;
    iVar2 = (uint)(byte)(*pcVar1 - 0x30U) + iVar2 * 10;
    *LineStr = pcVar3;
    pcVar1 = pcVar3;
    if (MaxValue <= iVar2) {
      iVar2 = MaxValue;
    }
  }
  return iVar2;
}

Assistant:

int ReadDigit(const char *&LineStr, int MaxValue) {
    int RetValue;
    RetValue = 0;
    while (1) {
        if (*LineStr >= '0' && *LineStr <= '9') {
            RetValue *= 10;
            RetValue += *LineStr - '0';
            LineStr ++;
            if (RetValue > MaxValue) {
                RetValue = MaxValue;
            }
        } else {
            break;
        }
    }
    return RetValue;
}